

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
::emplace_new_key<std::pair<std::type_index,std::any>>
          (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::type_index,_std::any> *key)

{
  long lVar1;
  long lVar2;
  char __tmp;
  ulong uVar3;
  undefined7 in_register_00000031;
  pair<std::type_index,_std::any> *__p;
  int8_t iVar4;
  sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
  sVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
  pVar10;
  value_type to_insert;
  pair<std::type_index,_std::any> pStack_48;
  
  if (*(long *)(this + 8) != 0) {
    uVar3 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar5 = SUB81(uVar3,0);
    if (this[0x11] != sVar5) {
      lVar2 = *(long *)(this + 0x18) + 1;
      auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar8._0_8_ = lVar2;
      auVar8._12_4_ = 0x45300000;
      lVar1 = *(long *)(this + 8) + 1;
      auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar9._0_8_ = lVar1;
      auVar9._12_4_ = 0x45300000;
      if ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x14) *
          ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        if (-1 < current_entry->distance_from_desired) {
          std::pair<std::type_index,_std::any>::pair(&pStack_48,key);
          iVar4 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar5;
          __p = (pair<std::type_index,_std::any> *)&current_entry->field_1;
          psVar6 = current_entry;
          do {
            std::pair<std::type_index,_std::any>::swap(&pStack_48,__p);
            sVar5 = (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
                     )(iVar4 + '\x01');
            psVar7 = psVar6;
LAB_00167a26:
            psVar6 = psVar7 + 1;
            iVar4 = psVar6->distance_from_desired;
            if (iVar4 < '\0') {
              std::pair<std::type_index,_std::any>::pair(&psVar7[1].field_1.value,&pStack_48);
              psVar6->distance_from_desired = (int8_t)sVar5;
              *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
              uVar3 = CONCAT71((uint7)((ulong)&pStack_48 >> 8) & 0xffffff,1);
              goto LAB_00167aa3;
            }
            if ((char)sVar5 <= iVar4) goto code_r0x00167a34;
            psVar6->distance_from_desired = (int8_t)sVar5;
            __p = (pair<std::type_index,_std::any> *)&psVar7[1].field_1;
          } while( true );
        }
        std::pair<std::type_index,_std::any>::pair(&(current_entry->field_1).value,key);
        current_entry->distance_from_desired = (int8_t)sVar5;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar3 = CONCAT71((int7)(uVar3 >> 8),1);
        goto LAB_001679cd;
      }
    }
  }
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  ::grow((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
          *)this);
  pVar10 = emplace<std::pair<std::type_index,std::any>>(this,key);
  current_entry = (EntryPointer)pVar10.first.current;
  uVar3 = (ulong)pVar10._8_4_;
LAB_001679cd:
  pVar10._8_8_ = uVar3;
  pVar10.first.current = current_entry;
  return pVar10;
code_r0x00167a34:
  sVar5 = (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
           )((char)sVar5 + '\x01');
  psVar7 = psVar6;
  if (this[0x11] == sVar5) {
    std::pair<std::type_index,_std::any>::swap(&pStack_48,&(current_entry->field_1).value);
    sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
    ::grow((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
            *)this);
    pVar10 = emplace<std::pair<std::type_index,std::any>>(this,&pStack_48);
    current_entry = (EntryPointer)pVar10.first.current;
    uVar3 = (ulong)pVar10._8_4_;
LAB_00167aa3:
    std::any::reset(&pStack_48.second);
    goto LAB_001679cd;
  }
  goto LAB_00167a26;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }